

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar11;
  Fad<double> *pFVar12;
  Fad<double> *pFVar13;
  FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
  *this_00;
  value_type vVar14;
  
  pFVar11 = (this->left_->fadexpr_).right_;
  pFVar12 = (pFVar11->fadexpr_).left_;
  pFVar13 = (pFVar11->fadexpr_).right_;
  dVar1 = (pFVar12->dx_).ptr_to_data[i];
  dVar2 = (pFVar13->dx_).ptr_to_data[i];
  dVar3 = pFVar12->val_;
  dVar4 = pFVar13->val_;
  dVar5 = (((this->left_->fadexpr_).left_)->dx_).ptr_to_data[i];
  this_00 = &((this->right_->fadexpr_).right_)->fadexpr_;
  pFVar11 = (this_00->left_->fadexpr_).left_;
  dVar6 = ((pFVar11->fadexpr_).left_)->val_;
  dVar7 = ((pFVar11->fadexpr_).right_)->val_;
  dVar8 = ((this_00->left_->fadexpr_).right_)->val_;
  dVar9 = this_00->right_->val_;
  dVar10 = (this->right_->fadexpr_).left_.constant_;
  vVar14 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
           ::fastAccessDx(this_00,i);
  pFVar11 = (this->left_->fadexpr_).right_;
  return vVar14 * (((this->left_->fadexpr_).left_)->val_ -
                  ((pFVar11->fadexpr_).left_)->val_ * ((pFVar11->fadexpr_).right_)->val_) +
         (dVar6 * dVar7 * dVar8 * dVar9 + dVar10) * (dVar5 - (dVar1 * dVar4 + dVar2 * dVar3));
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}